

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relaxng.c
# Opt level: O1

void xmlRelaxNGCheckReference(void *payload,void *data,xmlChar *name)

{
  xmlHashTablePtr table;
  void *pvVar1;
  char *msg;
  int error;
  xmlNodePtr node;
  
  if ((*(byte *)((long)payload + 99) & 1) != 0) {
    return;
  }
  if (*(long *)((long)data + 0x30) == 0) {
    node = *(xmlNodePtr *)((long)payload + 8);
    msg = "Internal error: no grammar in CheckReference %s\n";
  }
  else {
    if (*(long *)((long)payload + 0x30) == 0) {
      table = *(xmlHashTablePtr *)(*(long *)((long)data + 0x30) + 0x30);
      if ((table != (xmlHashTablePtr)0x0) &&
         (pvVar1 = xmlHashLookup(table,name), pvVar1 != (void *)0x0)) {
        for (; payload != (void *)0x0; payload = *(void **)((long)payload + 0x58)) {
          *(void **)((long)payload + 0x30) = pvVar1;
        }
        return;
      }
      node = *(xmlNodePtr *)((long)payload + 8);
      msg = "Reference %s has no matching definition\n";
      error = 0x44d;
      goto LAB_00174c5a;
    }
    node = *(xmlNodePtr *)((long)payload + 8);
    msg = "Internal error: reference has content in CheckReference %s\n";
  }
  error = 1;
LAB_00174c5a:
  xmlRngPErr((xmlRelaxNGParserCtxtPtr)data,node,error,msg,name,(xmlChar *)0x0);
  return;
}

Assistant:

static void
xmlRelaxNGCheckReference(void *payload, void *data, const xmlChar * name)
{
    xmlRelaxNGDefinePtr ref = (xmlRelaxNGDefinePtr) payload;
    xmlRelaxNGParserCtxtPtr ctxt = (xmlRelaxNGParserCtxtPtr) data;
    xmlRelaxNGGrammarPtr grammar;
    xmlRelaxNGDefinePtr def, cur;

    /*
     * Those rules don't apply to imported ref from xmlRelaxNGParseImportRef
     */
    if (ref->dflags & IS_EXTERNAL_REF)
        return;

    grammar = ctxt->grammar;
    if (grammar == NULL) {
        xmlRngPErr(ctxt, ref->node, XML_ERR_INTERNAL_ERROR,
                   "Internal error: no grammar in CheckReference %s\n",
                   name, NULL);
        return;
    }
    if (ref->content != NULL) {
        xmlRngPErr(ctxt, ref->node, XML_ERR_INTERNAL_ERROR,
                   "Internal error: reference has content in CheckReference %s\n",
                   name, NULL);
        return;
    }
    if (grammar->defs != NULL) {
        def = xmlHashLookup(grammar->defs, name);
        if (def != NULL) {
            cur = ref;
            while (cur != NULL) {
                cur->content = def;
                cur = cur->nextHash;
            }
        } else {
            xmlRngPErr(ctxt, ref->node, XML_RNGP_REF_NO_DEF,
                       "Reference %s has no matching definition\n", name,
                       NULL);
        }
    } else {
        xmlRngPErr(ctxt, ref->node, XML_RNGP_REF_NO_DEF,
                   "Reference %s has no matching definition\n", name,
                   NULL);
    }
}